

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void db_close_and_remove(void)

{
  size_t *psVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  fdb_status fVar5;
  int iVar6;
  code *__s;
  size_t sVar7;
  size_t sVar8;
  fdb_doc **__s_00;
  fdb_kvs_config *pfVar9;
  time_t tVar10;
  uint8_t *puVar11;
  btree *pbVar12;
  ulong uVar13;
  fdb_file_handle **ptr_fhandle;
  long lVar14;
  fdb_kvs_handle **ppfVar15;
  fdb_config *fconfig;
  uint uVar16;
  char *info;
  char *pcVar17;
  fdb_kvs_handle *pfVar18;
  fdb_kvs_ops_info *info_00;
  fdb_doc *pfVar19;
  char *info_01;
  fdb_doc **ppfVar20;
  btree *pbVar21;
  bool bVar22;
  timeval tVar23;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  int iStack_1bb4;
  fdb_doc *pfStack_1bb0;
  fdb_file_handle *pfStack_1ba8;
  undefined4 uStack_1ba0;
  undefined3 uStack_1b9c;
  undefined1 uStack_1b99;
  fdb_kvs_handle *pfStack_1b98;
  uint uStack_1b8c;
  timeval tStack_1b88;
  timeval tStack_1b78;
  timeval tStack_1b68;
  fdb_file_info fStack_1b58;
  char acStack_1b10 [1032];
  fdb_config *pfStack_1708;
  fdb_kvs_ops_info *pfStack_1700;
  fdb_doc *pfStack_16f8;
  btree *pbStack_16f0;
  btree *pbStack_16e8;
  fdb_config *pfStack_16e0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_doc *pfStack_16c0;
  fdb_iterator *pfStack_16b8;
  undefined8 uStack_16b0;
  fdb_kvs_handle *apfStack_16a8 [4];
  undefined1 auStack_1688 [64];
  undefined1 auStack_1648 [32];
  undefined1 auStack_1628 [56];
  undefined1 auStack_15f0 [40];
  btree bStack_15c8;
  char acStack_1578 [256];
  undefined1 auStack_1478 [16];
  undefined1 auStack_1468 [16];
  undefined1 auStack_1458 [16];
  undefined1 auStack_1448 [16];
  undefined1 auStack_1438 [16];
  fdb_doc afStack_1428 [3];
  fdb_config fStack_1328;
  char *pcStack_1230;
  fdb_kvs_ops_info *pfStack_1228;
  fdb_doc *pfStack_1220;
  fdb_config *pfStack_1218;
  undefined1 *puStack_1210;
  fdb_doc **ppfStack_1208;
  undefined1 auStack_1200 [24];
  fdb_config fStack_11e8;
  char acStack_10f0 [256];
  char acStack_ff0 [256];
  fdb_kvs_handle **ppfStack_ef0;
  fdb_kvs_config *pfStack_ee8;
  fdb_doc **ppfStack_ee0;
  fdb_doc *pfStack_ec8;
  fdb_kvs_handle *pfStack_ec0;
  fdb_kvs_handle *pfStack_eb8;
  fdb_file_handle *pfStack_eb0;
  fdb_kvs_handle *pfStack_ea8;
  fdb_kvs_config fStack_ea0;
  timeval tStack_e88;
  fdb_doc *apfStack_e78 [31];
  fdb_config fStack_d80;
  char acStack_c88 [256];
  fdb_doc *apfStack_b88 [32];
  char acStack_a88 [264];
  fdb_kvs_handle **ppfStack_980;
  fdb_kvs_ops_info *pfStack_978;
  fdb_doc *pfStack_970;
  fdb_kvs_config *pfStack_968;
  fdb_doc **ppfStack_960;
  fdb_doc **ppfStack_958;
  fdb_kvs_handle *pfStack_948;
  fdb_kvs_handle *pfStack_940;
  undefined1 auStack_938 [32];
  fdb_kvs_config fStack_918;
  timeval tStack_900;
  fdb_kvs_ops_info afStack_8f0 [4];
  fdb_doc *apfStack_7f0 [32];
  char acStack_6f0 [256];
  fdb_config fStack_5f0;
  fdb_file_handle **ppfStack_4f8;
  long lStack_4f0;
  fdb_doc *pfStack_4e8;
  size_t sStack_4e0;
  fdb_doc **ppfStack_4d8;
  fdb_doc **ppfStack_4d0;
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  timeval local_4b0;
  fdb_kvs_config local_4a0;
  fdb_doc *apfStack_488 [10];
  char local_438 [264];
  fdb_config local_330;
  fdb_doc *local_238 [32];
  char local_138 [264];
  
  ppfStack_4d0 = (fdb_doc **)0x112047;
  gettimeofday(&local_4b0,(__timezone_ptr_t)0x0);
  ppfStack_4d0 = (fdb_doc **)0x11204c;
  memleak_start();
  ppfStack_4d0 = (fdb_doc **)0x112058;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_4d0 = (fdb_doc **)0x112068;
  fdb_get_default_config();
  ppfStack_4d0 = (fdb_doc **)0x112075;
  fdb_get_default_kvs_config();
  local_330.cleanup_cache_onclose = false;
  ppfStack_4d0 = (fdb_doc **)0x112090;
  fdb_open(&local_4b8,"./dummy1",&local_330);
  ppfStack_4d0 = (fdb_doc **)0x1120a2;
  fdb_kvs_open(local_4b8,&local_4c0,(char *)0x0,&local_4a0);
  info_00 = (fdb_kvs_ops_info *)0x0;
  uVar13 = 0;
  do {
    ppfStack_4d0 = (fdb_doc **)0x1120c2;
    sprintf(local_138,"key%d",uVar13 & 0xffffffff);
    ppfStack_4d0 = (fdb_doc **)0x1120da;
    sprintf((char *)local_238,"meta%d",uVar13 & 0xffffffff);
    ppfStack_4d0 = (fdb_doc **)0x1120f2;
    sprintf(local_438,"body%d",uVar13 & 0xffffffff);
    ppfVar20 = (fdb_doc **)((long)apfStack_488 + (long)info_00);
    ppfStack_4d0 = (fdb_doc **)0x112102;
    __s = (code *)strlen(local_138);
    __s_00 = local_238;
    ppfStack_4d0 = (fdb_doc **)0x112115;
    sVar7 = strlen((char *)__s_00);
    ppfStack_4d0 = (fdb_doc **)0x112125;
    sVar8 = strlen(local_438);
    ppfStack_4d0 = (fdb_doc **)0x11214a;
    fdb_doc_create(ppfVar20,local_138,(size_t)__s,__s_00,sVar7,local_438,sVar8);
    ppfStack_4d0 = (fdb_doc **)0x112159;
    fdb_set(local_4c0,apfStack_488[uVar13]);
    ppfStack_4d0 = (fdb_doc **)0x112163;
    fdb_doc_free(apfStack_488[uVar13]);
    uVar13 = uVar13 + 1;
    info_00 = (fdb_kvs_ops_info *)((long)info_00 + 8);
  } while (uVar13 != 10);
  ppfStack_4d0 = (fdb_doc **)0x112180;
  fVar5 = fdb_commit(local_4b8,'\0');
  if (fVar5 == FDB_RESULT_SUCCESS) {
    ppfStack_4d0 = (fdb_doc **)0x112192;
    fdb_kvs_close(local_4c0);
    ptr_fhandle = &local_4b8;
    ppfStack_4d0 = (fdb_doc **)0x11219f;
    fdb_close(local_4b8);
    ppfStack_4d0 = (fdb_doc **)0x1121ab;
    system("rm -rf  dummy* > errorlog.txt");
    local_330.flags = 2;
    ppfStack_4d0 = (fdb_doc **)0x1121c9;
    fVar5 = fdb_open(ptr_fhandle,"./dummy1",&local_330);
    if (fVar5 == FDB_RESULT_NO_SUCH_FILE) {
      ppfStack_4d0 = (fdb_doc **)0x1121d3;
      fdb_shutdown();
      ppfStack_4d0 = (fdb_doc **)0x1121d8;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (db_close_and_remove()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_4d0 = (fdb_doc **)0x112209;
      fprintf(_stderr,pcVar17,"db close and remove");
      return;
    }
  }
  else {
    ppfStack_4d0 = (fdb_doc **)0x112220;
    db_close_and_remove();
    ptr_fhandle = (fdb_file_handle **)0xa;
  }
  ppfStack_4d0 = (fdb_doc **)db_drop_test;
  db_close_and_remove();
  ppfStack_958 = (fdb_doc **)0x112242;
  ppfStack_4f8 = ptr_fhandle;
  lStack_4f0 = (long)info_00;
  pfStack_4e8 = (fdb_doc *)__s;
  sStack_4e0 = sVar7;
  ppfStack_4d8 = ppfVar20;
  ppfStack_4d0 = __s_00;
  gettimeofday(&tStack_900,(__timezone_ptr_t)0x0);
  ppfStack_958 = (fdb_doc **)0x112247;
  memleak_start();
  pfStack_948 = (fdb_kvs_handle *)0x0;
  ppfStack_958 = (fdb_doc **)0x11225c;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_958 = (fdb_doc **)0x11226c;
  fdb_get_default_config();
  pfVar9 = &fStack_918;
  ppfStack_958 = (fdb_doc **)0x112279;
  fdb_get_default_kvs_config();
  fStack_5f0.buffercache_size = 0x1000000;
  fStack_5f0.wal_threshold = 0x400;
  fStack_5f0.flags = 1;
  fStack_5f0.compaction_threshold = '\0';
  ppfVar20 = (fdb_doc **)auStack_938;
  ppfStack_958 = (fdb_doc **)0x1122ab;
  fdb_open((fdb_file_handle **)ppfVar20,"./dummy1",&fStack_5f0);
  ppfStack_958 = (fdb_doc **)0x1122c0;
  fdb_kvs_open((fdb_file_handle *)auStack_938._0_8_,&pfStack_940,(char *)0x0,pfVar9);
  ppfStack_958 = (fdb_doc **)0x1122d6;
  fVar5 = fdb_set_log_callback(pfStack_940,logCallbackFunc,"db_drop_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    info_00 = (fdb_kvs_ops_info *)0x0;
    uVar13 = 0;
    do {
      ppfStack_958 = (fdb_doc **)0x1122fe;
      sprintf(acStack_6f0,"key%d",uVar13 & 0xffffffff);
      ppfStack_958 = (fdb_doc **)0x112316;
      sprintf((char *)apfStack_7f0,"meta%d",uVar13 & 0xffffffff);
      ppfStack_958 = (fdb_doc **)0x11232b;
      sprintf((char *)afStack_8f0,"body%d",uVar13 & 0xffffffff);
      ppfVar20 = (fdb_doc **)(auStack_938 + (long)info_00 + 8);
      ppfStack_958 = (fdb_doc **)0x11233b;
      __s = (code *)strlen(acStack_6f0);
      __s_00 = apfStack_7f0;
      ppfStack_958 = (fdb_doc **)0x11234e;
      sVar7 = strlen((char *)__s_00);
      ppfStack_958 = (fdb_doc **)0x11235b;
      sVar8 = strlen((char *)afStack_8f0);
      ppfStack_958 = (fdb_doc **)0x11237d;
      fdb_doc_create(ppfVar20,acStack_6f0,(size_t)__s,__s_00,sVar7,afStack_8f0,sVar8);
      ppfStack_958 = (fdb_doc **)0x11238c;
      fdb_set(pfStack_940,*(fdb_doc **)(auStack_938 + uVar13 * 8 + 8));
      uVar13 = uVar13 + 1;
      info_00 = (fdb_kvs_ops_info *)((long)info_00 + 8);
    } while (uVar13 == 1);
    pfVar9 = (fdb_kvs_config *)auStack_938;
    ppfStack_958 = (fdb_doc **)0x1123ac;
    fdb_commit((fdb_file_handle *)auStack_938._0_8_,'\0');
    ppfStack_958 = (fdb_doc **)0x1123b9;
    fdb_kvs_close(pfStack_940);
    ppfStack_958 = (fdb_doc **)0x1123c1;
    fdb_close((fdb_file_handle *)auStack_938._0_8_);
    ppfStack_958 = (fdb_doc **)0x1123cd;
    system("rm -rf  dummy1 > errorlog.txt");
    ppfStack_958 = (fdb_doc **)0x1123e4;
    fdb_open((fdb_file_handle **)pfVar9,"./dummy1",&fStack_5f0);
    ppfStack_958 = (fdb_doc **)0x1123f4;
    fdb_kvs_open_default((fdb_file_handle *)auStack_938._0_8_,&pfStack_940,&fStack_918);
    ppfStack_958 = (fdb_doc **)0x11240a;
    fVar5 = fdb_set_log_callback(pfStack_940,logCallbackFunc,"db_drop_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011259f;
    ppfStack_958 = (fdb_doc **)0x11242d;
    sprintf(acStack_6f0,"key%d",0);
    ppfVar20 = apfStack_7f0;
    ppfStack_958 = (fdb_doc **)0x112448;
    sprintf((char *)ppfVar20,"meta%d",0);
    info_00 = afStack_8f0;
    ppfStack_958 = (fdb_doc **)0x112460;
    sprintf((char *)info_00,"body%d",0);
    pfVar9 = (fdb_kvs_config *)(auStack_938 + 8);
    ppfStack_958 = (fdb_doc **)0x11246d;
    fdb_doc_free((fdb_doc *)auStack_938._8_8_);
    ppfStack_958 = (fdb_doc **)0x112475;
    __s = (code *)strlen(acStack_6f0);
    ppfStack_958 = (fdb_doc **)0x112480;
    __s_00 = (fdb_doc **)strlen((char *)ppfVar20);
    ppfStack_958 = (fdb_doc **)0x11248b;
    sVar7 = strlen((char *)info_00);
    ppfStack_958 = (fdb_doc **)0x1124a6;
    fdb_doc_create((fdb_doc **)pfVar9,acStack_6f0,(size_t)__s,ppfVar20,(size_t)__s_00,info_00,sVar7)
    ;
    ppfStack_958 = (fdb_doc **)0x1124b3;
    fdb_set(pfStack_940,(fdb_doc *)auStack_938._8_8_);
    ppfStack_958 = (fdb_doc **)0x1124bf;
    fdb_commit((fdb_file_handle *)auStack_938._0_8_,'\0');
    ppfVar15 = &pfStack_948;
    ppfStack_958 = (fdb_doc **)0x1124e6;
    fdb_doc_create((fdb_doc **)ppfVar15,*(void **)(auStack_938._8_8_ + 0x20),
                   *(size_t *)auStack_938._8_8_,(void *)0x0,0,(void *)0x0,0);
    ppfStack_958 = (fdb_doc **)0x1124f3;
    fVar5 = fdb_get(pfStack_940,(fdb_doc *)pfStack_948);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      if (pfStack_948->fhandle != (fdb_file_handle *)0x1) {
        ppfStack_958 = (fdb_doc **)0x112511;
        db_drop_test();
      }
      ppfStack_958 = (fdb_doc **)0x11251b;
      fdb_kvs_close(pfStack_940);
      ppfStack_958 = (fdb_doc **)0x112525;
      fdb_close((fdb_file_handle *)auStack_938._0_8_);
      ppfStack_958 = (fdb_doc **)0x11252f;
      fdb_doc_free((fdb_doc *)pfStack_948);
      pfStack_948 = (fdb_kvs_handle *)0x0;
      lVar14 = 0;
      do {
        ppfStack_958 = (fdb_doc **)0x112544;
        fdb_doc_free(*(fdb_doc **)(auStack_938 + lVar14 * 8 + 8));
        lVar14 = lVar14 + 1;
      } while (lVar14 == 1);
      ppfStack_958 = (fdb_doc **)0x112552;
      fdb_shutdown();
      ppfStack_958 = (fdb_doc **)0x112557;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (db_drop_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_958 = (fdb_doc **)0x112588;
      fprintf(_stderr,pcVar17,"Database drop test");
      return;
    }
  }
  else {
    ppfStack_958 = (fdb_doc **)0x11259f;
    db_drop_test();
LAB_0011259f:
    ppfVar15 = &pfStack_940;
    ppfStack_958 = (fdb_doc **)0x1125a4;
    db_drop_test();
  }
  ppfStack_958 = (fdb_doc **)db_destroy_test;
  db_drop_test();
  ppfStack_ee0 = (fdb_doc **)0x1125c6;
  ppfStack_980 = ppfVar15;
  pfStack_978 = info_00;
  pfStack_970 = (fdb_doc *)__s;
  pfStack_968 = pfVar9;
  ppfStack_960 = ppfVar20;
  ppfStack_958 = __s_00;
  gettimeofday(&tStack_e88,(__timezone_ptr_t)0x0);
  ppfStack_ee0 = (fdb_doc **)0x1125cb;
  memleak_start();
  pfStack_ec0 = (fdb_kvs_handle *)0x0;
  ppfStack_ee0 = (fdb_doc **)0x1125e0;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_ee0 = (fdb_doc **)0x1125f0;
  fdb_get_default_config();
  pfVar9 = &fStack_ea0;
  ppfStack_ee0 = (fdb_doc **)0x1125fd;
  fdb_get_default_kvs_config();
  fStack_d80.buffercache_size = 0x1000000;
  fStack_d80.wal_threshold = 0x400;
  fStack_d80.flags = 1;
  fStack_d80.compaction_threshold = '\0';
  ppfVar20 = &pfStack_ec8;
  ppfStack_ee0 = (fdb_doc **)0x11262f;
  fdb_open((fdb_file_handle **)ppfVar20,"./dummy1",&fStack_d80);
  ppfVar15 = &pfStack_eb8;
  ppfStack_ee0 = (fdb_doc **)0x112644;
  fdb_kvs_open((fdb_file_handle *)pfStack_ec8,ppfVar15,(char *)0x0,pfVar9);
  ppfStack_ee0 = (fdb_doc **)0x11265a;
  fVar5 = fdb_set_log_callback(pfStack_eb8,logCallbackFunc,"db_destroy_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    info_00 = (fdb_kvs_ops_info *)0x0;
    uVar13 = 0;
    do {
      ppfStack_ee0 = (fdb_doc **)0x112682;
      sprintf(acStack_a88,"key%d",uVar13 & 0xffffffff);
      ppfStack_ee0 = (fdb_doc **)0x11269a;
      sprintf((char *)apfStack_b88,"meta%d",uVar13 & 0xffffffff);
      ppfStack_ee0 = (fdb_doc **)0x1126b2;
      sprintf(acStack_c88,"body%d",uVar13 & 0xffffffff);
      ppfVar20 = (fdb_doc **)((long)apfStack_e78 + (long)info_00);
      ppfStack_ee0 = (fdb_doc **)0x1126c2;
      __s = (code *)strlen(acStack_a88);
      __s_00 = apfStack_b88;
      ppfStack_ee0 = (fdb_doc **)0x1126d5;
      pfVar9 = (fdb_kvs_config *)strlen((char *)__s_00);
      ppfStack_ee0 = (fdb_doc **)0x1126e5;
      sVar7 = strlen(acStack_c88);
      ppfStack_ee0 = (fdb_doc **)0x11270a;
      fdb_doc_create(ppfVar20,acStack_a88,(size_t)__s,__s_00,(size_t)pfVar9,acStack_c88,sVar7);
      ppfStack_ee0 = (fdb_doc **)0x112719;
      fdb_set(pfStack_eb8,apfStack_e78[uVar13]);
      uVar13 = uVar13 + 1;
      info_00 = (fdb_kvs_ops_info *)((long)info_00 + 8);
    } while (uVar13 != 0x1e);
    ppfStack_ee0 = (fdb_doc **)0x112736;
    fdb_commit((fdb_file_handle *)pfStack_ec8,'\0');
    ppfStack_ee0 = (fdb_doc **)0x112752;
    fdb_open(&pfStack_eb0,"./dummy2",&fStack_d80);
    ppfVar15 = &pfStack_ea8;
    ppfStack_ee0 = (fdb_doc **)0x112769;
    fdb_kvs_open(pfStack_eb0,ppfVar15,(char *)0x0,&fStack_ea0);
    ppfStack_ee0 = (fdb_doc **)0x11277f;
    fVar5 = fdb_set_log_callback(pfStack_ea8,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011290e;
    lVar14 = 0;
    do {
      ppfStack_ee0 = (fdb_doc **)0x112798;
      fdb_set(pfStack_ea8,apfStack_e78[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x1e);
    ppfStack_ee0 = (fdb_doc **)0x1127ad;
    fdb_commit(pfStack_eb0,'\0');
    ppfStack_ee0 = (fdb_doc **)0x1127b7;
    fdb_close((fdb_file_handle *)pfStack_ec8);
    ppfStack_ee0 = (fdb_doc **)0x1127cb;
    fVar5 = fdb_destroy("./dummy2",&fStack_d80);
    ppfVar15 = (fdb_kvs_handle **)0x1e;
    if (fVar5 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00112913;
    ppfStack_ee0 = (fdb_doc **)0x1127de;
    fdb_close(pfStack_eb0);
    ppfStack_ee0 = (fdb_doc **)0x1127f2;
    fVar5 = fdb_destroy("./dummy1",&fStack_d80);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112918;
    ppfStack_ee0 = (fdb_doc **)0x112816;
    fdb_open((fdb_file_handle **)&pfStack_ec8,"./dummy1",&fStack_d80);
    ppfVar15 = &pfStack_eb8;
    ppfStack_ee0 = (fdb_doc **)0x11282d;
    fdb_kvs_open((fdb_file_handle *)pfStack_ec8,ppfVar15,(char *)0x0,&fStack_ea0);
    ppfStack_ee0 = (fdb_doc **)0x112843;
    fVar5 = fdb_set_log_callback(pfStack_eb8,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011291d;
    ppfVar15 = &pfStack_ec0;
    ppfStack_ee0 = (fdb_doc **)0x112874;
    fdb_doc_create((fdb_doc **)ppfVar15,apfStack_e78[0]->key,apfStack_e78[0]->keylen,(void *)0x0,0,
                   (void *)0x0,0);
    ppfStack_ee0 = (fdb_doc **)0x112881;
    fVar5 = fdb_get(pfStack_eb8,(fdb_doc *)pfStack_ec0);
    if (fVar5 == FDB_RESULT_KEY_NOT_FOUND) {
      ppfStack_ee0 = (fdb_doc **)0x112894;
      fdb_close((fdb_file_handle *)pfStack_ec8);
      ppfStack_ee0 = (fdb_doc **)0x11289e;
      fdb_doc_free((fdb_doc *)pfStack_ec0);
      pfStack_ec0 = (fdb_kvs_handle *)0x0;
      lVar14 = 0;
      do {
        ppfStack_ee0 = (fdb_doc **)0x1128b3;
        fdb_doc_free(apfStack_e78[lVar14]);
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x1e);
      ppfStack_ee0 = (fdb_doc **)0x1128c1;
      fdb_shutdown();
      ppfStack_ee0 = (fdb_doc **)0x1128c6;
      memleak_end();
      pcVar17 = "%s PASSED\n";
      if (db_destroy_test()::__test_pass != '\0') {
        pcVar17 = "%s FAILED\n";
      }
      ppfStack_ee0 = (fdb_doc **)0x1128f7;
      fprintf(_stderr,pcVar17,"Database destroy test");
      return;
    }
  }
  else {
    ppfStack_ee0 = (fdb_doc **)0x11290e;
    db_destroy_test();
LAB_0011290e:
    ppfStack_ee0 = (fdb_doc **)0x112913;
    db_destroy_test();
LAB_00112913:
    ppfStack_ee0 = (fdb_doc **)0x112918;
    db_destroy_test();
LAB_00112918:
    ppfStack_ee0 = (fdb_doc **)0x11291d;
    db_destroy_test();
LAB_0011291d:
    ppfStack_ee0 = (fdb_doc **)0x112922;
    db_destroy_test();
  }
  ppfStack_ee0 = (fdb_doc **)db_destroy_test_full_path;
  db_destroy_test();
  pbVar21 = (btree *)auStack_1200;
  pbVar12 = (btree *)auStack_1200;
  ppfStack_1208 = (fdb_doc **)0x11293f;
  ppfStack_ef0 = ppfVar15;
  pfStack_ee8 = pfVar9;
  ppfStack_ee0 = ppfVar20;
  gettimeofday((timeval *)(auStack_1200 + 8),(__timezone_ptr_t)0x0);
  ppfStack_1208 = (fdb_doc **)0x112944;
  memleak_start();
  ppfStack_1208 = (fdb_doc **)0x11294b;
  tVar10 = time((time_t *)0x0);
  ppfStack_1208 = (fdb_doc **)0x112952;
  srand((uint)tVar10);
  ppfStack_1208 = (fdb_doc **)0x112957;
  iVar6 = rand();
  ppfStack_1208 = (fdb_doc **)0x11298f;
  sprintf(acStack_ff0,"/tmp/fdb_destroy_test_%d",(ulong)(uint)(iVar6 % 10000));
  ppfStack_1208 = (fdb_doc **)0x1129ab;
  sprintf(acStack_10f0,"rm -rf %s*",acStack_ff0);
  ppfStack_1208 = (fdb_doc **)0x1129b3;
  system(acStack_10f0);
  ppfStack_1208 = (fdb_doc **)0x1129c0;
  fdb_get_default_config();
  fStack_11e8.compaction_mode = '\x01';
  ppfStack_1208 = (fdb_doc **)0x1129d6;
  fdb_open((fdb_file_handle **)auStack_1200,acStack_ff0,&fStack_11e8);
  ppfStack_1208 = (fdb_doc **)0x1129de;
  fdb_close((fdb_file_handle *)auStack_1200._0_8_);
  ppfStack_1208 = (fdb_doc **)0x1129e9;
  pcVar17 = acStack_ff0;
  fVar5 = fdb_destroy(acStack_ff0,&fStack_11e8);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    ppfStack_1208 = (fdb_doc **)0x1129f2;
    fdb_shutdown();
    ppfStack_1208 = (fdb_doc **)0x1129f7;
    memleak_end();
    pcVar17 = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      pcVar17 = "%s FAILED\n";
    }
    ppfStack_1208 = (fdb_doc **)0x112a28;
    fprintf(_stderr,pcVar17,"Database destroy (full path) test");
    return;
  }
  ppfStack_1208 = (fdb_doc **)operational_stats_test;
  db_destroy_test_full_path();
  info = (char *)((ulong)pcVar17 & 0xffffffff);
  info_01 = (char *)0x0;
  pfStack_16e0 = (fdb_config *)0x112a5f;
  pcStack_1230 = acStack_ff0;
  pfStack_1228 = info_00;
  pfStack_1220 = (fdb_doc *)__s;
  pfStack_1218 = &fStack_11e8;
  puStack_1210 = auStack_1200;
  ppfStack_1208 = __s_00;
  gettimeofday((timeval *)(auStack_15f0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_16e0 = (fdb_config *)0x112a64;
  memleak_start();
  pfStack_16c0 = (fdb_doc *)auStack_1478;
  auStack_1688._0_16_ = (undefined1  [16])0x0;
  auStack_1688._16_8_ = (void *)0x0;
  auStack_1688._24_8_ = (kvs_info *)0x0;
  auStack_1688._32_8_ = (fdb_config *)0x0;
  auStack_1688._40_8_ = (fdb_file_handle *)0x0;
  auStack_1688._48_8_ = (hbtrie *)0x0;
  auStack_1478 = (undefined1  [16])0x0;
  auStack_1468 = (undefined1  [16])0x0;
  auStack_1448 = (undefined1  [16])0x0;
  auStack_1458._8_8_ = 0;
  auStack_1458._0_8_ = acStack_1578;
  auStack_1438._8_8_ = 0;
  auStack_1438._0_8_ = afStack_1428;
  pfStack_16e0 = (fdb_config *)0x112acb;
  system("rm -rf  dummy* > errorlog.txt");
  fconfig = &fStack_1328;
  pfStack_16e0 = (fdb_config *)0x112adb;
  fdb_get_default_config();
  pfStack_16e0 = (fdb_config *)0x112ae8;
  fdb_get_default_kvs_config();
  fStack_1328.buffercache_size = 0;
  fStack_1328.seqtree_opt = '\x01';
  fStack_1328.wal_threshold = 0x400;
  fStack_1328.flags = 1;
  fStack_1328.compaction_threshold = '\0';
  fStack_1328.multi_kv_instances = SUB81(info,0);
  pfStack_16e0 = (fdb_config *)0x112b1b;
  fdb_open((fdb_file_handle **)&pfStack_16c8,"./dummy1",fconfig);
  uStack_16b0._4_4_ = (int)pcVar17;
  if (uStack_16b0._4_4_ != 0) {
    fconfig = (fdb_config *)0x3;
    info_01 = (char *)0x18;
    pbVar21 = (btree *)auStack_1628;
    info_00 = (fdb_kvs_ops_info *)auStack_15f0;
    __s = logCallbackFunc;
    info = "operational_stats_test";
    do {
      pfStack_16e0 = (fdb_config *)0x112b63;
      sprintf((char *)pbVar21,"kv%d",(ulong)fconfig & 0xffffffff);
      pfStack_16e0 = (fdb_config *)0x112b7b;
      fVar5 = fdb_kvs_open((fdb_file_handle *)pfStack_16c8,
                           (fdb_kvs_handle **)((long)apfStack_16a8 + (long)info_01),(char *)pbVar21,
                           (fdb_kvs_config *)info_00);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113110;
      pfStack_16e0 = (fdb_config *)0x112b93;
      fVar5 = fdb_set_log_callback
                        (apfStack_16a8[(long)fconfig],logCallbackFunc,"operational_stats_test");
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011310b;
      info_01 = (char *)&((btree *)((long)info_01 + -0x38))->aux;
      bVar22 = fconfig != (fdb_config *)0x0;
      fconfig = (fdb_config *)&fconfig[-1].field_0xf7;
    } while (bVar22);
    auStack_1688._56_8_ = (btree *)0x3;
LAB_00112bed:
    puVar11 = &((btree *)auStack_1688._56_8_)->vsize;
    info = auStack_1628;
    fconfig = (fdb_config *)auStack_1688;
    info_01 = (char *)0x0;
    do {
      pfStack_16e0 = (fdb_config *)0x112c29;
      sprintf(acStack_1578,"key%d",(ulong)info_01 & 0xffffffff);
      __s = (code *)afStack_1428;
      pfStack_16e0 = (fdb_config *)0x112c45;
      sprintf((char *)__s,"body%d",(ulong)info_01 & 0xffffffff);
      info_00 = (fdb_kvs_ops_info *)(&bStack_15c8.ksize + (long)info_01 * 8);
      pfStack_16e0 = (fdb_config *)0x112c58;
      sVar7 = strlen(acStack_1578);
      pfStack_16e0 = (fdb_config *)0x112c64;
      sVar8 = strlen((char *)__s);
      pfStack_16e0 = (fdb_config *)0x112c86;
      fdb_doc_create((fdb_doc **)info_00,acStack_1578,sVar7 + 1,(void *)0x0,0,__s,sVar8 + 1);
      info_01 = (char *)((long)info_01 + 1);
      pbVar21 = (btree *)puVar11;
      do {
        pfStack_16e0 = (fdb_config *)0x112c9c;
        fVar5 = fdb_set((fdb_kvs_handle *)(&uStack_16b0)[(long)pbVar21],(fdb_doc *)info_00->num_sets
                       );
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_16e0 = (fdb_config *)0x11308a;
          operational_stats_test();
LAB_0011308a:
          pfStack_16e0 = (fdb_config *)0x11308f;
          operational_stats_test();
LAB_0011308f:
          pfStack_16e0 = (fdb_config *)0x1130a1;
          operational_stats_test();
          pfVar19 = (fdb_doc *)__s;
          goto LAB_001130a1;
        }
        pfStack_16e0 = (fdb_config *)0x112cb1;
        fVar5 = fdb_get_kvs_ops_info
                          ((fdb_kvs_handle *)(&uStack_16b0)[(long)pbVar21],(fdb_kvs_ops_info *)info)
        ;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011308a;
        auStack_1688._0_8_ = info_01;
        pfStack_16e0 = (fdb_config *)0x112cce;
        iVar6 = bcmp(info,fconfig,0x38);
        if (iVar6 != 0) goto LAB_0011308f;
        pbVar12 = (btree *)((long)&pbVar21[-1].aux + 7);
        bVar22 = 0 < (long)pbVar21;
        pbVar21 = pbVar12;
      } while (pbVar12 != (btree *)0x0 && bVar22);
    } while (info_01 != (char *)0xa);
    info_01 = auStack_1628;
    pbVar12 = (btree *)auStack_1688._56_8_;
    do {
      pfStack_16e0 = (fdb_config *)0x112d1a;
      fdb_iterator_init(apfStack_16a8[(long)pbVar12],&pfStack_16b8,(void *)0x0,0,(void *)0x0,0,0);
      pbVar21 = &bStack_15c8;
      pfVar19 = (fdb_doc *)__s;
      do {
        pfStack_16e0 = (fdb_config *)0x112d31;
        fVar5 = fdb_iterator_get(pfStack_16b8,&pfStack_16c0);
        __s = (code *)pfStack_16c0;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130a1;
        fconfig = (fdb_config *)pfStack_16c0->key;
        info_00 = *(fdb_kvs_ops_info **)pbVar21;
        info = (char *)info_00->num_gets;
        pfStack_16e0 = (fdb_config *)0x112d59;
        iVar6 = bcmp(fconfig,info,pfStack_16c0->keylen);
        if (iVar6 != 0) goto LAB_001130ab;
        fconfig = (fdb_config *)((fdb_doc *)__s)->body;
        info = (char *)info_00[1].num_dels;
        pfStack_16e0 = (fdb_config *)0x112d79;
        iVar6 = bcmp(fconfig,info,((fdb_doc *)__s)->bodylen);
        if (iVar6 != 0) goto LAB_001130c8;
        pfStack_16e0 = (fdb_config *)0x112d93;
        fVar5 = fdb_get_kvs_ops_info(apfStack_16a8[(long)pbVar12],(fdb_kvs_ops_info *)info_01);
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130a6;
        auStack_1688._40_8_ = (long)(fdb_kvs_handle **)auStack_1688._40_8_ + 1;
        auStack_1688._48_8_ = auStack_1688._48_8_ + 1;
        pfStack_16e0 = (fdb_config *)0x112dc1;
        iVar6 = bcmp(info_01,auStack_1688,0x38);
        if (iVar6 != 0) goto LAB_001130b6;
        pfStack_16e0 = (fdb_config *)0x112dd3;
        fVar5 = fdb_iterator_next(pfStack_16b8);
        pbVar21 = (btree *)&pbVar21->root_bid;
        pfVar19 = (fdb_doc *)__s;
      } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
      auStack_1688._48_8_ = auStack_1688._48_8_ + 1;
      pfStack_16e0 = (fdb_config *)0x112df2;
      fdb_iterator_close(pfStack_16b8);
      pfStack_16e0 = (fdb_config *)0x112e01;
      fdb_commit((fdb_file_handle *)pfStack_16c8,'\x01');
      auStack_1688._16_8_ = (void *)(auStack_1688._16_8_ + 1);
      pfStack_16e0 = (fdb_config *)0x112e18;
      fVar5 = fdb_get_kvs_ops_info(apfStack_16a8[(long)pbVar12],(fdb_kvs_ops_info *)info_01);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113101;
      pfStack_16e0 = (fdb_config *)0x112e32;
      iVar6 = bcmp(info_01,auStack_1688,0x38);
      if (iVar6 != 0) goto LAB_001130ef;
      if (pbVar12 != (btree *)0x0) {
        auStack_1688._40_8_ = (fdb_file_handle *)0x0;
        auStack_1688._48_8_ = (hbtrie *)0x0;
      }
      bVar22 = 0 < (long)pbVar12;
      pbVar12 = (btree *)((long)&pbVar12[-1].aux + 7);
    } while (bVar22);
    auStack_1688._24_8_ = auStack_1688._24_8_ + 1;
    pfStack_16e0 = (fdb_config *)0x112e74;
    fdb_compact((fdb_file_handle *)pfStack_16c8,"./dummy2");
    pfStack_16e0 = (fdb_config *)0x112e86;
    fVar5 = fdb_get_kvs_ops_info(apfStack_16a8[0],(fdb_kvs_ops_info *)auStack_1628);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113115;
    pfStack_16e0 = (fdb_config *)0x112ea5;
    iVar6 = bcmp(auStack_1628,auStack_1688,0x38);
    info_01 = (char *)auStack_1688._56_8_;
    if (iVar6 == 0) {
      pbVar21 = (btree *)(auStack_1688._56_8_ + 1);
      info_00 = (fdb_kvs_ops_info *)auStack_1628;
      __s = (code *)auStack_1688;
      fconfig = (fdb_config *)0x0;
      do {
        pfStack_16e0 = (fdb_config *)0x112ee2;
        sprintf(acStack_1578,"key%d",(ulong)fconfig & 0xffffffff);
        info = (char *)((long)&fconfig->chunksize + 1);
        info_01 = (char *)pbVar21;
        do {
          if (((ulong)fconfig & 1) == 0) {
            if (((ulong)fconfig & 2) == 0) {
              pfStack_16e0 = (fdb_config *)0x112f01;
              fVar5 = fdb_get_metaonly((fdb_kvs_handle *)(&uStack_16b0)[(long)info_01],pfStack_16c0)
              ;
            }
            else {
              pfStack_16c0->seqnum = (fdb_seqnum_t)info;
              pfStack_16e0 = (fdb_config *)0x112f27;
              fVar5 = fdb_get_byseq((fdb_kvs_handle *)(&uStack_16b0)[(long)info_01],pfStack_16c0);
            }
          }
          else {
            pfStack_16e0 = (fdb_config *)0x112f12;
            fVar5 = fdb_get((fdb_kvs_handle *)(&uStack_16b0)[(long)info_01],pfStack_16c0);
          }
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d3;
          pfStack_16e0 = (fdb_config *)0x112f3c;
          fVar5 = fdb_get_kvs_ops_info((fdb_kvs_handle *)(&uStack_16b0)[(long)info_01],info_00);
          if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001130d8;
          pfStack_16e0 = (fdb_config *)0x112f59;
          auStack_1688._32_8_ = info;
          iVar6 = bcmp(info_00,__s,0x38);
          if (iVar6 != 0) goto LAB_001130dd;
          pbVar12 = (btree *)((long)&((btree *)((long)info_01 + -0x38))->aux + 7);
          bVar22 = 0 < (long)info_01;
          info_01 = (char *)pbVar12;
        } while (pbVar12 != (btree *)0x0 && bVar22);
        fconfig = (fdb_config *)info;
      } while ((fdb_config *)info != (fdb_config *)0xa);
      fconfig = (fdb_config *)auStack_1648;
      pbVar21 = (btree *)&stderr;
      info_01 = "%d:\t%u\t%u\t%u\t%lu\n";
      info = (char *)0x0;
      while( true ) {
        auStack_1648._0_16_ = (undefined1  [16])0x0;
        auStack_1648._16_8_ = (docio_handle *)0x0;
        pfStack_16e0 = (fdb_config *)0x112fb5;
        fVar5 = fdb_get_latency_stats
                          ((fdb_file_handle *)pfStack_16c8,(fdb_latency_stat *)fconfig,
                           (fdb_latency_stat_type)info);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_16e0 = (fdb_config *)0x112fea;
        fprintf(_stderr,"%d:\t%u\t%u\t%u\t%lu\n",info);
        uVar16 = (int)info + 1;
        info = (char *)(ulong)uVar16;
        if (uVar16 == 0x13) {
          pfStack_16e0 = (fdb_config *)0x112ffb;
          fdb_close((fdb_file_handle *)pfStack_16c8);
          lVar14 = 0;
          do {
            pfStack_16e0 = (fdb_config *)0x11300a;
            fdb_doc_free(*(fdb_doc **)(&bStack_15c8.ksize + lVar14 * 8));
            lVar14 = lVar14 + 1;
          } while (lVar14 != 10);
          pfStack_16e0 = (fdb_config *)0x113018;
          fdb_shutdown();
          pfStack_16e0 = (fdb_config *)0x11301d;
          memleak_end();
          pcVar17 = "single kv instance";
          if (uStack_16b0._4_1_ != '\0') {
            pcVar17 = "multiple kv instances";
          }
          pfStack_16e0 = (fdb_config *)0x11304d;
          sprintf((char *)afStack_1428,"Operational stats test %s",pcVar17);
          pcVar17 = "%s PASSED\n";
          if (operational_stats_test(bool)::__test_pass != '\0') {
            pcVar17 = "%s FAILED\n";
          }
          pfStack_16e0 = (fdb_config *)0x113073;
          fprintf(_stderr,pcVar17,afStack_1428);
          return;
        }
      }
      goto LAB_00113106;
    }
    goto LAB_0011311a;
  }
  pfStack_16e0 = (fdb_config *)0x112bc3;
  pfVar18 = pfStack_16c8;
  fVar5 = fdb_kvs_open_default
                    ((fdb_file_handle *)pfStack_16c8,apfStack_16a8,(fdb_kvs_config *)auStack_15f0);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_16e0 = (fdb_config *)0x112be3;
    pfVar18 = apfStack_16a8[0];
    fVar5 = fdb_set_log_callback(apfStack_16a8[0],logCallbackFunc,"operational_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113131;
    auStack_1688._56_8_ = (btree *)0x0;
    goto LAB_00112bed;
  }
  goto LAB_0011312c;
LAB_001130a1:
  __s = (code *)pfVar19;
  pfStack_16e0 = (fdb_config *)0x1130a6;
  operational_stats_test();
LAB_001130a6:
  pfStack_16e0 = (fdb_config *)0x1130ab;
  operational_stats_test();
LAB_001130ab:
  pfStack_16e0 = (fdb_config *)0x1130b6;
  operational_stats_test();
LAB_001130b6:
  pfStack_16e0 = (fdb_config *)0x1130c8;
  operational_stats_test();
LAB_001130c8:
  pfStack_16e0 = (fdb_config *)0x1130d3;
  operational_stats_test();
LAB_001130d3:
  pfStack_16e0 = (fdb_config *)0x1130d8;
  operational_stats_test();
LAB_001130d8:
  pfStack_16e0 = (fdb_config *)0x1130dd;
  operational_stats_test();
LAB_001130dd:
  pfStack_16e0 = (fdb_config *)0x1130ef;
  operational_stats_test();
LAB_001130ef:
  pfStack_16e0 = (fdb_config *)0x113101;
  operational_stats_test();
LAB_00113101:
  pfStack_16e0 = (fdb_config *)0x113106;
  operational_stats_test();
LAB_00113106:
  pfStack_16e0 = (fdb_config *)0x11310b;
  operational_stats_test();
LAB_0011310b:
  pfStack_16e0 = (fdb_config *)0x113110;
  operational_stats_test();
LAB_00113110:
  pfStack_16e0 = (fdb_config *)0x113115;
  operational_stats_test();
LAB_00113115:
  pfStack_16e0 = (fdb_config *)0x11311a;
  operational_stats_test();
LAB_0011311a:
  pfVar18 = (fdb_kvs_handle *)auStack_1688;
  pfStack_16e0 = (fdb_config *)0x11312c;
  operational_stats_test();
LAB_0011312c:
  pfStack_16e0 = (fdb_config *)0x113131;
  operational_stats_test();
  pbVar12 = pbVar21;
LAB_00113131:
  pfStack_16e0 = (fdb_config *)_worker_thread;
  operational_stats_test();
  pfStack_1708 = fconfig;
  pfStack_1700 = info_00;
  pfStack_16f8 = (fdb_doc *)__s;
  pbStack_16f0 = (btree *)info_01;
  pbStack_16e8 = pbVar12;
  pfStack_16e0 = (fdb_config *)info;
  gettimeofday(&tStack_1b68,(__timezone_ptr_t)0x0);
  pfStack_1bb0 = (fdb_doc *)0x0;
  sprintf(acStack_1b10,"dummy%d",(ulong)*(uint *)&pfVar18->file->filename);
  fdb_open(&pfStack_1ba8,acStack_1b10,(fdb_config *)pfVar18->btreeblkops);
  fdb_kvs_open_default(pfStack_1ba8,&pfStack_1b98,(fdb_kvs_config *)pfVar18->fileops);
  fVar5 = fdb_set_log_callback(pfStack_1b98,logCallbackFunc,"worker_thread");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x6c4);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x6c4,"void *_worker_thread(void *)");
  }
  pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
  *(int *)(pfVar18->field_6).seqtree = *(int *)(pfVar18->field_6).seqtree + 1;
  pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
  while( true ) {
    pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
    pbVar21 = (pfVar18->field_6).seqtree;
    iVar6._0_1_ = pbVar21->ksize;
    iVar6._1_1_ = pbVar21->vsize;
    iVar6._2_2_ = pbVar21->height;
    if ((list *)(pfVar18->kvs_config).custom_cmp == (list *)(long)iVar6) break;
    pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
    sleep(1);
  }
  pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
  gettimeofday((timeval *)&tStack_1b78,(__timezone_ptr_t)0x0);
  uStack_1b99 = 0;
  uVar13 = 0;
  iStack_1bb4 = 0;
  do {
    iVar6 = rand();
    iVar6 = (int)((ulong)(long)iVar6 % (ulong)(pfVar18->kvs_config).custom_cmp_param);
    psVar1 = (size_t *)(&pfVar18->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>._M_i
    ;
    fdb_doc_create(&pfStack_1bb0,(void *)psVar1[4],*psVar1,(void *)0x0,0,(void *)0x0,0);
    fVar5 = fdb_get(pfStack_1b98,pfStack_1bb0);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e1);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e1,"void *_worker_thread(void *)");
    }
    plVar2 = (long *)pfStack_1bb0->body;
    plVar3 = *(long **)((&pfVar18->op_stats->num_sets)[iVar6].super___atomic_base<unsigned_long>.
                        _M_i + 0x40);
    if (*plVar2 != *plVar3) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",plVar3,plVar2,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x6e2);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x6e2,"void *_worker_thread(void *)");
    }
    if (pfVar18->kvs != (kvs_info *)0x0) {
      uStack_1ba0 = (undefined4)plVar2[1];
      uStack_1b9c = (undefined3)((uint)*(undefined4 *)((long)plVar2 + 0xb) >> 8);
      iVar6 = atoi((char *)&uStack_1ba0);
      sprintf((char *)&uStack_1ba0,"%0 7d",(ulong)(iVar6 + 1));
      pvVar4 = pfStack_1bb0->body;
      *(uint *)((long)pvVar4 + 0xb) = CONCAT31(uStack_1b9c,uStack_1ba0._3_1_);
      *(undefined4 *)((long)pvVar4 + 8) = uStack_1ba0;
      fVar5 = fdb_set(pfStack_1b98,pfStack_1bb0);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x6f0);
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x6f0,"void *_worker_thread(void *)");
      }
      if ((pfVar18->trie != (hbtrie *)0x0) && (uVar13 % (ulong)pfVar18->trie == 0)) {
        fdb_commit(pfStack_1ba8,'\0');
        iStack_1bb4 = iStack_1bb4 + 1;
        fdb_get_file_info(pfStack_1ba8,&fStack_1b58);
        if ((pfVar18->staletree == (btree *)(long)iStack_1bb4) &&
           (((pfVar18->staletree != (btree *)0x0 && (fStack_1b58.new_filename == (char *)0x0)) &&
            (*(int *)&pfVar18->kvs_config == 0)))) {
          pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
          uStack_1b8c = *(int *)&pfVar18->file->filename + 1;
          *(uint *)&pfVar18->file->filename = uStack_1b8c;
          pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
          iStack_1bb4 = 0;
          sprintf(acStack_1b10,"dummy%d",(ulong)uStack_1b8c);
          fVar5 = fdb_compact(pfStack_1ba8,acStack_1b10);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pthread_spin_lock((pthread_spinlock_t *)pfVar18->dhandle);
            *(int *)&pfVar18->file->filename = *(int *)&pfVar18->file->filename + -1;
            pthread_spin_unlock((pthread_spinlock_t *)pfVar18->dhandle);
          }
        }
      }
    }
    fdb_doc_free(pfStack_1bb0);
    pfStack_1bb0 = (fdb_doc *)0x0;
    uVar13 = uVar13 + 1;
    gettimeofday((timeval *)&tStack_1b88,(__timezone_ptr_t)0x0);
    tVar23 = _utime_gap(tStack_1b78,tStack_1b88);
  } while ((fdb_file_handle *)tVar23.tv_sec < pfVar18->fhandle);
  pcVar17 = "writer";
  if (pfVar18->kvs == (kvs_info *)0x0) {
    pcVar17 = "reader";
  }
  printf("Thread #%d (%s) %d ops / %d seconds\n",(ulong)*(uint *)&pfVar18->kvs_config,pcVar17,
         uVar13 & 0xffffffff);
  pfVar18->bhandle = (btreeblk_handle *)(uVar13 & 0xffffffff);
  fdb_commit(pfStack_1ba8,'\x01');
  fdb_kvs_close(pfStack_1b98);
  fdb_close(pfStack_1ba8);
  pthread_exit((void *)0x0);
}

Assistant:

void db_close_and_remove()
{

    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc *, n);
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], metabuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();
    fconfig.cleanup_cache_onclose = false;
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open(dbfile, &db, NULL, &kvs_config);

    // write to db
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
        fdb_doc_free(doc[i]);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // remove dbfile
    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // re-open read-only
    fconfig.flags = FDB_OPEN_FLAG_RDONLY;
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_NO_SUCH_FILE);

    fdb_shutdown();
    memleak_end();
    TEST_RESULT("db close and remove");
}